

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttachedPart.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::AttachedPart::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AttachedPart *this)

{
  ostream *poVar1;
  KINT32 Value;
  char *pcVar2;
  bool bVar3;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Attached Part:",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tDetached:             ",0x18);
  bVar3 = this->m_ui8DetachedIndicator == '\0';
  pcVar2 = "True";
  if (bVar3) {
    pcVar2 = "False";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_190,pcVar2,(ulong)bVar3 | 4);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tPart Attached To ID:  ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tParameter Type:       ",0x18);
  ENUMS::GetEnumAsStringAttachedPartParameterType_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui32APPT,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tType:                 ",0x18);
  EntityType::GetAsString_abi_cxx11_(&local_1e0,&this->m_AttachedPartType);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString AttachedPart::GetAsString() const
{
    KStringStream ss;

    ss << "Attached Part:"
       << "\n\tDetached:             " << ( m_ui8DetachedIndicator == 0 ? "False" : "True" )
       << "\n\tPart Attached To ID:  " << m_ui16PartAttachedToID
       << "\n\tParameter Type:       " << GetEnumAsStringAttachedPartParameterType( m_ui32APPT )
       << "\n\tType:                 " << m_AttachedPartType.GetAsString();

    return ss.str();
}